

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> * __thiscall
dg::vr::StructureAnalyzer::possibleSources
          (vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
           *__return_storage_ptr__,StructureAnalyzer *this,PHINode *phi,bool bval)

{
  pointer *pppVVar1;
  uint uVar2;
  long lVar3;
  iterator __position;
  uint uVar4;
  PHINode *pPVar5;
  VRLocation *pVVar6;
  uint uVar7;
  long lVar8;
  Instruction *ptr;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  _Head_base<0UL,_dg::vr::VREdge_*,_false> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = *(uint *)(phi + 0x14);
  uVar9 = (ulong)(uVar7 & 0x7ffffff);
  if ((uVar7 & 0x7ffffff) != 0) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      if ((uVar7 >> 0x1e & 1) == 0) {
        pPVar5 = phi + uVar9 * -0x20;
      }
      else {
        pPVar5 = *(PHINode **)(phi + -8);
      }
      lVar3 = *(long *)(pPVar5 + lVar8);
      if ((lVar3 == 0) || (*(char *)(lVar3 + 0x10) != '\x10')) {
LAB_0012782a:
        if ((uVar7 >> 0x1e & 1) == 0) {
          pPVar5 = phi + uVar9 * -0x20;
        }
        else {
          pPVar5 = *(PHINode **)(phi + -8);
        }
        ptr = (Instruction *)
              (**(long **)(*(long *)(pPVar5 + uVar10 * 8 + (ulong)*(uint *)(phi + 0x3c) * 0x20) +
                          0x28) + -0x18);
        if (**(long **)(*(long *)(pPVar5 + uVar10 * 8 + (ulong)*(uint *)(phi + 0x3c) * 0x20) + 0x28)
            == 0) {
          ptr = (Instruction *)0x0;
        }
        pVVar6 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 8),ptr);
        local_38._M_head_impl =
             *(VREdge **)
              &(((pVVar6->successors).
                 super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
          _M_realloc_insert<dg::vr::VREdge*>
                    ((vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>> *)
                     __return_storage_ptr__,__position,&local_38._M_head_impl);
        }
        else {
          *__position._M_current = local_38._M_head_impl;
          pppVVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
        uVar7 = *(uint *)(phi + 0x14);
      }
      else {
        uVar2 = *(uint *)(lVar3 + 0x20);
        if (0x40 < uVar2) {
          uVar4 = llvm::APInt::countLeadingZerosSlowCase();
          if (!bval || uVar4 != uVar2 - 1) {
            bVar11 = uVar4 == uVar2;
            goto LAB_0012781b;
          }
          goto LAB_0012782a;
        }
        if (bval && *(long *)(lVar3 + 0x18) == 1) goto LAB_0012782a;
        bVar11 = *(long *)(lVar3 + 0x18) == 0;
LAB_0012781b:
        if (bVar11 && !bval) goto LAB_0012782a;
      }
      uVar10 = uVar10 + 1;
      uVar9 = (ulong)(uVar7 & 0x7ffffff);
      lVar8 = lVar8 + 0x20;
    } while (uVar10 < uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const VREdge *>
StructureAnalyzer::possibleSources(const llvm::PHINode *phi, bool bval) const {
    std::vector<const VREdge *> result;
    for (unsigned i = 0; i < phi->getNumIncomingValues(); ++i) {
        const llvm::Value *val = phi->getIncomingValue(i);
        const auto *cVal = llvm::dyn_cast<llvm::ConstantInt>(val);

        if (!cVal || (cVal->isOne() && bval) || (cVal->isZero() && !bval)) {
            const auto *block = phi->getIncomingBlock(i);
            const VRLocation &end = codeGraph.getVRLocation(
                    &*std::prev(std::prev(block->end())));
            assert(end.succsSize() == 1);
            result.emplace_back(end.getSuccEdge(0));
        }
    }
    return result;
}